

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest13::deinit(FunctionalTest13 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_1c;
  uint n_id;
  Functions *gl;
  FunctionalTest13 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_pipeline_id != 0) {
    (**(code **)(lVar3 + 0x450))(1,&this->m_pipeline_id);
    this->m_pipeline_id = 0;
  }
  if (this->m_read_buffer != (uchar *)0x0) {
    if (this->m_read_buffer != (uchar *)0x0) {
      operator_delete__(this->m_read_buffer);
    }
    this->m_read_buffer = (uchar *)0x0;
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (this->m_fs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_fs_po_ids[local_1c]);
      this->m_fs_po_ids[local_1c] = 0;
    }
    if (this->m_gs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_gs_po_ids[local_1c]);
      this->m_gs_po_ids[local_1c] = 0;
    }
    if (this->m_tc_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_tc_po_ids[local_1c]);
      this->m_tc_po_ids[local_1c] = 0;
    }
    if (this->m_te_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_te_po_ids[local_1c]);
      this->m_te_po_ids[local_1c] = 0;
    }
    if (this->m_vs_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_vs_po_ids[local_1c]);
      this->m_vs_po_ids[local_1c] = 0;
    }
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  (**(code **)(lVar3 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  return;
}

Assistant:

void FunctionalTest13::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_pipeline_id != 0)
	{
		gl.deleteProgramPipelines(1, &m_pipeline_id);

		m_pipeline_id = 0;
	}

	if (m_read_buffer != DE_NULL)
	{
		delete[] m_read_buffer;

		m_read_buffer = DE_NULL;
	}

	for (unsigned int n_id = 0; n_id < 2 /* po id variants */; ++n_id)
	{
		if (m_fs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_fs_po_ids[n_id]);

			m_fs_po_ids[n_id] = 0;
		}

		if (m_gs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_gs_po_ids[n_id]);

			m_gs_po_ids[n_id] = 0;
		}

		if (m_tc_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_tc_po_ids[n_id]);

			m_tc_po_ids[n_id] = 0;
		}

		if (m_te_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_te_po_ids[n_id]);

			m_te_po_ids[n_id] = 0;
		}

		if (m_vs_po_ids[n_id] != 0)
		{
			gl.deleteProgram(m_vs_po_ids[n_id]);

			m_vs_po_ids[n_id] = 0;
		}
	} /* for (both shader program object variants) */

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Restore default GL_PATCH_VERTICES setting value */
	gl.patchParameteri(GL_PATCH_VERTICES, 3);

	/* Restore default GL_PACK_ALIGNMENT setting value */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
}